

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

QString * QSslSocket::activeBackend(void)

{
  long lVar1;
  qsizetype qVar2;
  QMutexLocker<QMutex> *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  QMutexLocker<QMutex> *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QMutexLocker<QMutex>::QMutexLocker(in_RDI,(QMutex *)in_RDI);
  qVar2 = QString::size(&QSslSocketPrivate::activeBackendName);
  if (qVar2 == 0) {
    QTlsBackend::defaultBackendName();
    QString::operator=((QString *)this,(QString *)in_RDI);
    QString::~QString((QString *)0x3a3bd7);
  }
  QString::QString((QString *)this,(QString *)in_RDI);
  QMutexLocker<QMutex>::~QMutexLocker(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)this;
  }
  __stack_chk_fail();
}

Assistant:

QString QSslSocket::activeBackend()
{
    const QMutexLocker locker(&QSslSocketPrivate::backendMutex);

    if (!QSslSocketPrivate::activeBackendName.size())
        QSslSocketPrivate::activeBackendName = QTlsBackend::defaultBackendName();

    return QSslSocketPrivate::activeBackendName;
}